

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void __thiscall
fill<16U,_2U,_buffer_layout_dfs>::operator()
          (fill<16U,_2U,_buffer_layout_dfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  uchar *__s1;
  unsigned_long *puVar1;
  int iVar2;
  unsigned_long *puVar3;
  long lVar4;
  unsigned_long uVar5;
  uchar **from0;
  uchar *__s2;
  unsigned_long uVar6;
  long lVar7;
  size_t __n;
  size_t n0;
  fill<16U,_4U,_buffer_layout_dfs> local_5c;
  fill<16U,_5U,_buffer_layout_dfs> local_5b;
  fill<16U,_5U,_buffer_layout_dfs> local_5a;
  fill<16U,_4U,_buffer_layout_dfs> local_59;
  array<Stream,_16UL> *local_58;
  unsigned_long *local_50;
  unsigned_long *local_48;
  long local_40;
  uchar **local_38;
  
  puVar3 = buffer_count->_M_elems + 4;
  local_50 = buffer_count->_M_elems + 5;
  local_38 = buffer + 8;
  lVar7 = 0;
  n0 = 0;
  local_58 = streams;
  local_48 = puVar3;
  do {
    uVar5 = *puVar3;
    if (uVar5 == 0) {
      fill<16U,_4U,_buffer_layout_dfs>::operator()(&local_59,local_58,buffer,buffer_count);
      uVar5 = buffer_count->_M_elems[4];
      if (uVar5 == 0) {
        uVar5 = *local_50;
        lVar7 = -0x40 - lVar7;
        lVar4 = 8 - n0;
        break;
      }
    }
    uVar6 = *local_50;
    local_40 = lVar7;
    if (uVar6 == 0) {
      fill<16U,_5U,_buffer_layout_dfs>::operator()(&local_5a,local_58,buffer,buffer_count);
      uVar5 = buffer_count->_M_elems[4];
      uVar6 = buffer_count->_M_elems[5];
      if (uVar6 == 0) {
        __n = -local_40;
        lVar7 = -n0;
        goto LAB_00161783;
      }
    }
    __s1 = buffer[0x48 - uVar5];
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = buffer[0x98 - uVar6];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar2 = strcmp((char *)__s1,(char *)__s2);
    puVar3 = local_48;
    puVar1 = local_50;
    if (iVar2 < 1) {
      __s2 = __s1;
      puVar1 = local_48;
      uVar6 = uVar5;
    }
    *puVar1 = uVar6 - 1;
    buffer[n0] = __s2;
    check_input(buffer,n0);
    n0 = n0 + 1;
    lVar7 = local_40 + -8;
    if (n0 == 8) {
      buffer_count->_M_elems[2] = 8;
      return;
    }
  } while( true );
  do {
    if (uVar5 == 0) {
      fill<16U,_5U,_buffer_layout_dfs>::operator()(&local_5b,local_58,buffer,buffer_count);
      uVar5 = buffer_count->_M_elems[5];
      if (uVar5 == 0) {
        from0 = (uchar **)((long)buffer - lVar7);
        memmove(buffer + lVar4,buffer,lVar7 + 0x40);
        buffer_count->_M_elems[2] = n0;
        goto LAB_00161832;
      }
    }
    buffer[n0] = buffer[0x98 - uVar5];
    uVar5 = uVar5 - 1;
    *local_50 = uVar5;
    lVar4 = lVar4 + -1;
    n0 = n0 + 1;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0);
  goto LAB_001617d1;
LAB_00161783:
  do {
    if (uVar5 == 0) {
      fill<16U,_4U,_buffer_layout_dfs>::operator()(&local_5c,local_58,buffer,buffer_count);
      uVar5 = buffer_count->_M_elems[4];
      if (uVar5 == 0) {
        from0 = (uchar **)((long)local_38 - __n);
        n0 = -lVar7;
        memmove(local_38 + lVar7,buffer,__n);
        buffer_count->_M_elems[2] = n0;
        goto LAB_00161832;
      }
    }
    *(uchar **)((long)buffer + __n) = buffer[0x48 - uVar5];
    uVar5 = uVar5 - 1;
    *local_48 = uVar5;
    lVar7 = lVar7 + -1;
    __n = __n + 8;
  } while (__n != 0x40);
LAB_001617d1:
  buffer_count->_M_elems[2] = 8;
  n0 = 8;
  from0 = buffer;
LAB_00161832:
  check_input(from0,n0);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}